

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O2

bool cppcms::url_dispatcher::parse<point>
               (application *app,const_char_istream *p,cmatch *m,int group,point *v)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  value_type local_60;
  value_type local_48;
  
  booster::match_results<const_char_*>::operator[](&local_48,m,group);
  pcVar1 = local_48.super_pair<const_char_*,_const_char_*>.first;
  booster::match_results<const_char_*>::operator[](&local_60,m,group);
  cVar2 = cppcms::url_dispatcher::validate_encoding
                    (app,pcVar1,local_60.super_pair<const_char_*,_const_char_*>.second);
  if (cVar2 == '\0') {
    bVar3 = false;
  }
  else {
    booster::match_results<const_char_*>::operator[](&local_48,m,group);
    booster::match_results<const_char_*>::operator[](&local_60,m,group);
    util::const_char_istream::range
              (p,local_48.super_pair<const_char_*,_const_char_*>.first,
               local_60.super_pair<const_char_*,_const_char_*>.second);
    bVar3 = parse_url_parameter<point>(p,v);
  }
  return bVar3;
}

Assistant:

static bool parse(application &app,util::const_char_istream &p,booster::cmatch const &m,int group,T &v)
		{
			if(!validate_encoding(app,m[group].first,m[group].second))
				return false;
			p.range(m[group].first,m[group].second);
			return parse_url_parameter(p,v);
		}